

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O0

void Ivy_ManStartFanout(Ivy_Man_t *p)

{
  int iVar1;
  Ivy_Obj_t *pObj_00;
  Ivy_Obj_t *pIVar2;
  int local_1c;
  int i;
  Ivy_Obj_t *pObj;
  Ivy_Man_t *p_local;
  
  if (p->fFanout == 0) {
    p->fFanout = 1;
    for (local_1c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
      pObj_00 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,local_1c);
      if (pObj_00 != (Ivy_Obj_t *)0x0) {
        pIVar2 = Ivy_ObjFanin0(pObj_00);
        if (pIVar2 != (Ivy_Obj_t *)0x0) {
          pIVar2 = Ivy_ObjFanin0(pObj_00);
          Ivy_ObjAddFanout(p,pIVar2,pObj_00);
        }
        pIVar2 = Ivy_ObjFanin1(pObj_00);
        if (pIVar2 != (Ivy_Obj_t *)0x0) {
          pIVar2 = Ivy_ObjFanin1(pObj_00);
          Ivy_ObjAddFanout(p,pIVar2,pObj_00);
        }
      }
    }
    return;
  }
  __assert_fail("!p->fFanout",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFanout.c"
                ,0x8c,"void Ivy_ManStartFanout(Ivy_Man_t *)");
}

Assistant:

void Ivy_ManStartFanout( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    assert( !p->fFanout );
    p->fFanout = 1;
    Ivy_ManForEachObj( p, pObj, i )
    {
        if ( Ivy_ObjFanin0(pObj) )
            Ivy_ObjAddFanout( p, Ivy_ObjFanin0(pObj), pObj );
        if ( Ivy_ObjFanin1(pObj) )
            Ivy_ObjAddFanout( p, Ivy_ObjFanin1(pObj), pObj );
    }
}